

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O2

void dec_get_part_info(com_core_t *core,com_part_info_t *sub_info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  
  if ((uint)core->pb_part < 8) {
    iVar3 = core->cu_pix_x;
    iVar2 = core->cu_pix_y;
    iVar8 = core->cu_width;
    iVar1 = core->cu_height;
    iVar4 = iVar8 >> 2;
    iVar5 = iVar1 >> 2;
    switch(core->pb_part) {
    case 0:
      sub_info->num_sub_part = '\x01';
      sub_info->sub_x[0] = iVar3;
      sub_info->sub_y[0] = iVar2;
      sub_info->sub_w[0] = iVar8;
      sub_info->sub_h[0] = iVar1;
      break;
    case 1:
      sub_info->num_sub_part = '\x02';
      for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
        sub_info->sub_x[lVar6] = iVar3;
        iVar1 = iVar5;
        if (lVar6 == 0) {
          iVar1 = 0;
        }
        sub_info->sub_y[lVar6] = iVar1 + iVar2;
        sub_info->sub_w[lVar6] = iVar8;
        sub_info->sub_h[lVar6] = ((uint)(lVar6 != 0) * 2 + 1) * iVar5;
      }
      break;
    case 2:
      sub_info->num_sub_part = '\x02';
      for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
        sub_info->sub_x[lVar6] = iVar3;
        sub_info->sub_y[lVar6] = (uint)(lVar6 != 0) * iVar5 * 3 + iVar2;
        sub_info->sub_w[lVar6] = iVar8;
        sub_info->sub_h[lVar6] = ((uint)(lVar6 == 0) * 2 + 1) * iVar5;
      }
      break;
    case 3:
      sub_info->num_sub_part = '\x02';
      for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
        iVar8 = iVar4;
        if (lVar6 == 0) {
          iVar8 = 0;
        }
        sub_info->sub_x[lVar6] = iVar8 + iVar3;
        sub_info->sub_y[lVar6] = iVar2;
        sub_info->sub_w[lVar6] = ((uint)(lVar6 != 0) * 2 + 1) * iVar4;
        sub_info->sub_h[lVar6] = iVar1;
      }
      break;
    case 4:
      sub_info->num_sub_part = '\x02';
      for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
        sub_info->sub_x[lVar6] = (uint)(lVar6 != 0) * iVar4 * 3 + iVar3;
        sub_info->sub_y[lVar6] = iVar2;
        sub_info->sub_w[lVar6] = ((uint)(lVar6 == 0) * 2 + 1) * iVar4;
        sub_info->sub_h[lVar6] = iVar1;
      }
      break;
    case 5:
      sub_info->num_sub_part = '\x04';
      uVar7 = 0;
      for (uVar9 = 0; uVar9 != 4; uVar9 = uVar9 + 1) {
        sub_info->sub_x[uVar9] = (uVar7 & 2) * iVar4 + iVar3;
        sub_info->sub_y[uVar9] = iVar2 + (uint)(1 < uVar9) * iVar5 * 2;
        sub_info->sub_w[uVar9] = iVar4 * 2;
        sub_info->sub_h[uVar9] = iVar5 * 2;
        uVar7 = uVar7 + 2;
      }
      return;
    case 6:
      sub_info->num_sub_part = '\x04';
      for (lVar6 = -0x10; lVar6 != 0; lVar6 = lVar6 + 4) {
        *(int *)((long)sub_info->sub_y + lVar6) = iVar3;
        *(int *)((long)sub_info->sub_w + lVar6) = iVar2;
        *(int *)((long)sub_info->sub_h + lVar6) = iVar8;
        *(int *)((long)sub_info[1].sub_x + lVar6 + -4) = iVar5;
        iVar2 = iVar2 + iVar5;
      }
      break;
    case 7:
      sub_info->num_sub_part = '\x04';
      for (lVar6 = -0x10; lVar6 != 0; lVar6 = lVar6 + 4) {
        *(int *)((long)sub_info->sub_y + lVar6) = iVar3;
        *(int *)((long)sub_info->sub_w + lVar6) = iVar2;
        *(int *)((long)sub_info->sub_h + lVar6) = iVar4;
        *(int *)((long)sub_info[1].sub_x + lVar6 + -4) = iVar1;
        iVar3 = iVar3 + iVar4;
      }
    }
  }
  return;
}

Assistant:

void dec_get_part_info(com_core_t *core, com_part_info_t* sub_info)
{
    int i;
    int x = core->cu_pix_x;
    int y = core->cu_pix_y;
    int w = core->cu_width;
    int h = core->cu_height;
    int part_size = core->pb_part;
    int qw = w >> MIN_CU_LOG2;
    int qh = h >> MIN_CU_LOG2;

    switch (part_size)
    {
    case SIZE_2Nx2N:
        sub_info->num_sub_part = 1;
        sub_info->sub_x[0] = x;
        sub_info->sub_y[0] = y;
        sub_info->sub_w[0] = w;
        sub_info->sub_h[0] = h;
        break;
    case SIZE_2NxhN:
        sub_info->num_sub_part = 4;
        for (i = 0; i < sub_info->num_sub_part; i++)
        {
            sub_info->sub_x[i] = x;
            sub_info->sub_y[i] = qh * i + y;
            sub_info->sub_w[i] = w;
            sub_info->sub_h[i] = qh;
        }
        break;
    case SIZE_2NxnU:
        sub_info->num_sub_part = 2;
        for (i = 0; i < sub_info->num_sub_part; i++)
        {
            sub_info->sub_x[i] = x;
            sub_info->sub_y[i] = qh * (i == 0 ? 0 : 1) + y;
            sub_info->sub_w[i] = w;
            sub_info->sub_h[i] = qh * (i == 0 ? 1 : 3);
        }
        break;
    case SIZE_2NxnD:
        sub_info->num_sub_part = 2;
        for (i = 0; i < sub_info->num_sub_part; i++)
        {
            sub_info->sub_x[i] = x;
            sub_info->sub_y[i] = qh * (i == 0 ? 0 : 3) + y;
            sub_info->sub_w[i] = w;
            sub_info->sub_h[i] = qh * (i == 0 ? 3 : 1);
        }
        break;
    case SIZE_hNx2N:
        sub_info->num_sub_part = 4;
        for (i = 0; i < sub_info->num_sub_part; i++)
        {
            sub_info->sub_x[i] = qw * i + x;
            sub_info->sub_y[i] = y;
            sub_info->sub_w[i] = qw;
            sub_info->sub_h[i] = h;
        }
        break;
    case SIZE_nLx2N:
        sub_info->num_sub_part = 2;
        for (i = 0; i < sub_info->num_sub_part; i++)
        {
            sub_info->sub_x[i] = qw * (i == 0 ? 0 : 1) + x;
            sub_info->sub_y[i] = y;
            sub_info->sub_w[i] = qw * (i == 0 ? 1 : 3);
            sub_info->sub_h[i] = h;
        }
        break;
    case SIZE_nRx2N:
        sub_info->num_sub_part = 2;
        for (i = 0; i < sub_info->num_sub_part; i++)
        {
            sub_info->sub_x[i] = qw * (i == 0 ? 0 : 3) + x;
            sub_info->sub_y[i] = y;
            sub_info->sub_w[i] = qw * (i == 0 ? 3 : 1);
            sub_info->sub_h[i] = h;
        }
        break;
    case SIZE_NxN:
        sub_info->num_sub_part = 4;
        for (i = 0; i < sub_info->num_sub_part; i++)
        {
            sub_info->sub_x[i] = qw * (i == 0 || i == 2 ? 0 : 2) + x;
            sub_info->sub_y[i] = qh * (i == 0 || i == 1 ? 0 : 2) + y;
            sub_info->sub_w[i] = qw * 2;
            sub_info->sub_h[i] = qh * 2;
        }
        break;
    default:
        uavs3d_assert(0);
    }
}